

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O0

MPP_RET mpp_dump_deinit(MppDump *info)

{
  long *plVar1;
  Mutex *this;
  MppDumpImpl *p;
  MppDump *info_local;
  
  if ((info != (MppDump *)0x0) && (*info != (MppDump)0x0)) {
    plVar1 = (long *)*info;
    if (plVar1[5] != 0) {
      fclose((FILE *)plVar1[5]);
    }
    plVar1[5] = 0;
    if (plVar1[6] != 0) {
      fclose((FILE *)plVar1[6]);
    }
    plVar1[6] = 0;
    if (plVar1[7] != 0) {
      fclose((FILE *)plVar1[7]);
    }
    plVar1[7] = 0;
    if (plVar1[8] != 0) {
      mpp_osal_free("mpp_dump_deinit",(void *)plVar1[8]);
    }
    plVar1[8] = 0;
    if (*plVar1 != 0) {
      this = (Mutex *)*plVar1;
      if (this != (Mutex *)0x0) {
        Mutex::~Mutex(this);
        operator_delete(this,0x28);
      }
      *plVar1 = 0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dump_deinit(MppDump *info)
{
    if (info && *info) {
        MppDumpImpl *p = (MppDumpImpl *)*info;

        MPP_FCLOSE(p->fp_in);
        MPP_FCLOSE(p->fp_out);
        MPP_FCLOSE(p->fp_ops);
        MPP_FREE(p->fp_buf);

        if (p->lock) {
            delete p->lock;
            p->lock = NULL;
        }
    }

    return MPP_OK;
}